

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O0

void anon_unknown.dwarf_17e46d::setInputFrameBuffer
               (FrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int> *uData,
               Array2D<float> *fData,Array2D<half> *hData,int width,int height)

{
  uint *b;
  float *b_00;
  half *b_01;
  Array2D<float> *in_RCX;
  Array2D<unsigned_int> *in_RDX;
  int in_ESI;
  Array2D<half> *in_R8;
  int in_R9D;
  Slice *in_stack_00000190;
  char *in_stack_00000198;
  FrameBuffer *in_stack_000001a0;
  long in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff08;
  Array2D<half> *in_stack_ffffffffffffff10;
  Slice local_d8;
  Slice local_a0;
  Slice local_68;
  int local_2c;
  Array2D<half> *local_28;
  Array2D<float> *local_20;
  Array2D<unsigned_int> *local_18;
  
  local_2c = in_R9D;
  if (in_ESI == 0) {
    local_18 = in_RDX;
    Imf_2_5::Array2D<unsigned_int>::resizeErase
              ((Array2D<unsigned_int> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00);
    b = Imf_2_5::Array2D<unsigned_int>::operator[](local_18,0);
    Imf_2_5::Slice::Slice(&local_68,UINT,(char *)b,4,(long)local_2c << 2,1,1,0.0,false,false);
    Imf_2_5::FrameBuffer::insert(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  else if (in_ESI == 1) {
    local_20 = in_RCX;
    Imf_2_5::Array2D<float>::resizeErase
              ((Array2D<float> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff00);
    b_00 = Imf_2_5::Array2D<float>::operator[](local_20,0);
    Imf_2_5::Slice::Slice(&local_a0,FLOAT,(char *)b_00,4,(long)local_2c << 2,1,1,0.0,false,false);
    Imf_2_5::FrameBuffer::insert(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  else if (in_ESI == 2) {
    local_28 = in_R8;
    Imf_2_5::Array2D<half>::resizeErase
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    b_01 = Imf_2_5::Array2D<half>::operator[](local_28,0);
    Imf_2_5::Slice::Slice(&local_d8,HALF,(char *)b_01,2,(long)local_2c << 1,1,1,0.0,false,false);
    Imf_2_5::FrameBuffer::insert(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
  }
  return;
}

Assistant:

void setInputFrameBuffer(FrameBuffer& frameBuffer, int pixelType,
                         Array2D<unsigned int>& uData, Array2D<float>& fData,
                         Array2D<half>& hData, int width, int height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase(height, width);
            frameBuffer.insert ("UINT",
                                Slice (IMF::UINT,
                                (char *) (&uData[0][0]),
                                sizeof (uData[0][0]) * 1,
                                sizeof (uData[0][0]) * width,
                                1, 1,
                                0));
            break;
        case 1:
            fData.resizeErase(height, width);
            frameBuffer.insert ("FLOAT",
                                Slice (IMF::FLOAT,
                                (char *) (&fData[0][0]),
                                sizeof (fData[0][0]) * 1,
                                sizeof (fData[0][0]) * width,
                                1, 1,
                                0));
            break;
        case 2:
            hData.resizeErase(height, width);
            frameBuffer.insert ("HALF",
                                Slice (IMF::HALF,
                                (char *) (&hData[0][0]),
                                sizeof (hData[0][0]) * 1,
                                sizeof (hData[0][0]) * width,
                                1, 1,
                                0));
            break;
    }
}